

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

void __thiscall higan::HttpRequest::HttpRequest(HttpRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  this->method_ = HTTP_REQUEST_UNKNOWN;
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  (this->url_)._M_string_length = 0;
  (this->url_).field_2._M_local_buf[0] = '\0';
  this->version_ = HTTP_VERSION_UNKNOWN;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->headers_)._M_t._M_impl.super__Rb_tree_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Buffer::Buffer(&this->body_);
  return;
}

Assistant:

HttpRequest::HttpRequest():
		method_(HTTP_REQUEST_UNKNOWN),
		url_(),
		version_(HTTP_VERSION_UNKNOWN)
{

}